

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_modes(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,int tile_row,
                int tile_col)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  ENTROPY_CONTEXT *pEVar6;
  byte bVar7;
  byte bVar8;
  MACROBLOCK *pMVar9;
  MACROBLOCK *pMVar10;
  MACROBLOCKD *pMVar11;
  ENTROPY_CONTEXT (*paEVar12) [32];
  uint num_planes;
  CB_COEFF_BUFFER *pCVar13;
  size_t __n;
  int mi_col;
  int iVar14;
  int mi_row;
  uint mi_row_00;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  BLOCK_SIZE in_stack_ffffffffffffff68;
  TokenExtra *local_38;
  
  iVar2 = tile->mi_col_start;
  iVar3 = tile->mi_col_end;
  pSVar5 = (cpi->common).seq_params;
  uVar16 = -1L << ((byte)pSVar5->mib_size_log2 & 0x3f);
  bVar8 = (byte)pSVar5->subsampling_x;
  uVar16 = (long)(int)(~(uint)uVar16 + (iVar3 - iVar2)) & uVar16;
  bVar7 = bVar8 & 0x1f;
  iVar15 = iVar2 >> bVar7;
  bVar8 = bVar8 & 0x1f;
  uVar1 = pSVar5->monochrome;
  iVar14 = tile->tile_row;
  mi_row_00 = tile->mi_row_start;
  iVar4 = tile->mi_row_end;
  memset((cpi->common).above_contexts.entropy[0][iVar14] + iVar2,0 >> bVar7,uVar16);
  bVar17 = uVar1 == '\0';
  num_planes = bVar17 + 1 + (uint)bVar17;
  if (bVar17) {
    pEVar6 = (cpi->common).above_contexts.entropy[1][iVar14];
    if ((pEVar6 == (ENTROPY_CONTEXT *)0x0) ||
       ((cpi->common).above_contexts.entropy[2][iVar14] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid value of planes"
                        );
    }
    else {
      __n = (size_t)((int)uVar16 >> bVar8);
      memset(pEVar6 + iVar15,0 >> bVar8,__n);
      memset((cpi->common).above_contexts.entropy[2][iVar14] + iVar15,0,__n);
    }
  }
  memset((cpi->common).above_contexts.partition[iVar14] + iVar2,0,uVar16);
  memset((cpi->common).above_contexts.txfm[iVar14] + iVar2,0x40,uVar16);
  iVar14 = tile->tile_row;
  for (uVar16 = 0; num_planes != uVar16; uVar16 = uVar16 + 1) {
    (td->mb).e_mbd.above_entropy_context[uVar16] =
         (cpi->common).above_contexts.entropy[uVar16][iVar14];
  }
  (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[iVar14];
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[iVar14];
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) &&
     ((td->mb).e_mbd.current_base_qindex = (cpi->common).quant_params.base_qindex,
     (cpi->common).delta_q_info.delta_lf_present_flag != 0)) {
    av1_reset_loop_filter_delta(&(td->mb).e_mbd,num_planes);
  }
  pMVar9 = &td->mb;
  for (; (int)mi_row_00 < iVar4; mi_row_00 = mi_row_00 + ((cpi->common).seq_params)->mib_size) {
    bVar8 = (byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f;
    if (((cpi->token_info).tile_tok[0][0] == (TokenExtra *)0x0) ||
       ((cpi->token_info).tplist[0][0] == (TokenList *)0x0)) {
      local_38 = (TokenExtra *)(ulong)(uint)(0 >> bVar8);
    }
    else {
      local_38 = (cpi->token_info).tplist[tile_row][tile_col]
                 [(int)(mi_row_00 - tile->mi_row_start) >> bVar8].start;
    }
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x17) = '\0';
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0x1f) = '\0';
    pMVar11 = &(td->mb).e_mbd;
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 2) + 7) = '\0';
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 2) + 0xf) = '\0';
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x17) = '\0';
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0x1f) = '\0';
    pMVar11 = &(td->mb).e_mbd;
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 1) + 7) = '\0';
    paEVar12 = (td->mb).e_mbd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar12 + 1) + 0xf) = '\0';
    pMVar11 = &(td->mb).e_mbd;
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x17) = '\0';
    pMVar11 = &(td->mb).e_mbd;
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0x1f) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pMVar9->e_mbd).left_entropy_context + 0) + 7) = '\0';
    pMVar11 = &(td->mb).e_mbd;
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar11->left_entropy_context + 0) + 0xf) = '\0';
    pMVar10 = &td->mb;
    (pMVar10->e_mbd).left_partition_context[0x10] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x11] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x12] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x13] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x14] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x15] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x16] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x17] = '\0';
    pMVar10 = &td->mb;
    (pMVar10->e_mbd).left_partition_context[0x18] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x19] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1a] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1b] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1c] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1d] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1e] = '\0';
    (pMVar10->e_mbd).left_partition_context[0x1f] = '\0';
    (td->mb).e_mbd.left_partition_context[0] = '\0';
    (td->mb).e_mbd.left_partition_context[1] = '\0';
    (td->mb).e_mbd.left_partition_context[2] = '\0';
    (td->mb).e_mbd.left_partition_context[3] = '\0';
    (td->mb).e_mbd.left_partition_context[4] = '\0';
    (td->mb).e_mbd.left_partition_context[5] = '\0';
    (td->mb).e_mbd.left_partition_context[6] = '\0';
    (td->mb).e_mbd.left_partition_context[7] = '\0';
    pMVar10 = &td->mb;
    (pMVar10->e_mbd).left_partition_context[8] = '\0';
    (pMVar10->e_mbd).left_partition_context[9] = '\0';
    (pMVar10->e_mbd).left_partition_context[10] = '\0';
    (pMVar10->e_mbd).left_partition_context[0xb] = '\0';
    (pMVar10->e_mbd).left_partition_context[0xc] = '\0';
    (pMVar10->e_mbd).left_partition_context[0xd] = '\0';
    (pMVar10->e_mbd).left_partition_context[0xe] = '\0';
    (pMVar10->e_mbd).left_partition_context[0xf] = '\0';
    builtin_memcpy((td->mb).e_mbd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20);
    for (iVar14 = iVar2; iVar14 < iVar3; iVar14 = iVar14 + ((cpi->common).seq_params)->mib_size) {
      pCVar13 = av1_get_cb_coeff_buffer(cpi,mi_row_00,iVar14);
      (td->mb).cb_coef_buff = pCVar13;
      write_modes_sb(cpi,td,tile,w,&local_38,(TokenExtra *)(ulong)mi_row_00,iVar14,
                     (uint)((cpi->common).seq_params)->sb_size,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

static inline void write_modes(AV1_COMP *const cpi, ThreadData *const td,
                               const TileInfo *const tile, aom_writer *const w,
                               int tile_row, int tile_col) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  const int mi_row_start = tile->mi_row_start;
  const int mi_row_end = tile->mi_row_end;
  const int mi_col_start = tile->mi_col_start;
  const int mi_col_end = tile->mi_col_end;
  const int num_planes = av1_num_planes(cm);

  av1_zero_above_context(cm, xd, mi_col_start, mi_col_end, tile->tile_row);
  av1_init_above_context(&cm->above_contexts, num_planes, tile->tile_row, xd);

  if (cpi->common.delta_q_info.delta_q_present_flag) {
    xd->current_base_qindex = cpi->common.quant_params.base_qindex;
    if (cpi->common.delta_q_info.delta_lf_present_flag) {
      av1_reset_loop_filter_delta(xd, num_planes);
    }
  }

  for (int mi_row = mi_row_start; mi_row < mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    const int sb_row_in_tile =
        (mi_row - tile->mi_row_start) >> cm->seq_params->mib_size_log2;
    const TokenInfo *token_info = &cpi->token_info;
    const TokenExtra *tok;
    const TokenExtra *tok_end;
    get_token_pointers(token_info, tile_row, tile_col, sb_row_in_tile, &tok,
                       &tok_end);

    av1_zero_left_context(xd);

    for (int mi_col = mi_col_start; mi_col < mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      td->mb.cb_coef_buff = av1_get_cb_coeff_buffer(cpi, mi_row, mi_col);
      write_modes_sb(cpi, td, tile, w, &tok, tok_end, mi_row, mi_col,
                     cm->seq_params->sb_size);
    }
    assert(tok == tok_end);
  }
}